

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void * rw::imageOpen(void *object,int32 offset,int32 size)

{
  long lVar1;
  long lVar2;
  
  lVar1 = engine;
  lVar2 = (long)offset;
  imageModuleOffset = offset;
  *(undefined8 *)(engine + lVar2) = 0;
  *(undefined4 *)(lVar1 + 8 + lVar2) = 0;
  *(undefined4 *)(lVar1 + 0x100 + lVar2) = 0;
  return object;
}

Assistant:

static void*
imageOpen(void *object, int32 offset, int32 size)
{
	imageModuleOffset = offset;
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	g->searchPaths = nil;
	g->numSearchPaths = 0;
	g->numFileFormats = 0;
	return object;
}